

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunDeadAlocaStoreElimination(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SmallArray<VmInstruction_*,_128U> *this;
  uint uVar1;
  VmInstructionType VVar2;
  ScopeData *pSVar3;
  VariableData *container;
  VmConstant *pVVar4;
  VmValue **ppVVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  VmInstruction *pVVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint storePos;
  ulong uVar15;
  ulong uVar16;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 4)) {
    value = (VmValue *)0x0;
  }
  if ((((value != (VmValue *)0x0) &&
       (pSVar3 = *(ScopeData **)&value[1].typeID, pSVar3 != (ScopeData *)0x0)) &&
      (pSVar3 != ctx->globalScope)) && (uVar14 = (ulong)(pSVar3->allVariables).count, uVar14 != 0))
  {
    this = &module->tempInstructions;
    uVar9 = 0;
    do {
      container = (pSVar3->allVariables).data[uVar9];
      if ((container->isAlloca != true) || ((container->users).count != 0)) {
        bVar6 = HasAddressTaken(container);
        if (!bVar6) {
          (module->tempInstructions).count = 0;
          uVar8 = (ulong)(container->users).count;
          if (uVar8 != 0) {
            uVar10 = 0;
            bVar6 = false;
            bVar7 = false;
            do {
              pVVar4 = (container->users).data[uVar10];
              uVar16 = (ulong)(pVVar4->super_VmValue).users.count;
              if (uVar16 != 0) {
                uVar15 = 0;
                do {
                  pVVar11 = (VmInstruction *)(pVVar4->super_VmValue).users.data[uVar15];
                  if ((pVVar11 == (VmInstruction *)0x0) || ((pVVar11->super_VmValue).typeID != 2)) {
                    pVVar11 = (VmInstruction *)0x0;
                  }
                  if (pVVar11 != (VmInstruction *)0x0) {
                    if (pVVar11->cmd < VM_INST_LOAD_IMMEDIATE) {
                      bVar6 = true;
                    }
                    if (pVVar11->cmd - VM_INST_STORE_BYTE < 7) {
                      if ((pVVar11->arguments).count == 0) goto LAB_0028cc0c;
                      if ((VmConstant *)*(pVVar11->arguments).data == pVVar4) {
                        uVar1 = (module->tempInstructions).count;
                        if (uVar1 == (module->tempInstructions).max) {
                          SmallArray<VmInstruction_*,_128U>::grow(this,uVar1);
                        }
                        if (this->data == (VmInstruction **)0x0) goto LAB_0028cc2b;
                        uVar1 = (module->tempInstructions).count;
                        (module->tempInstructions).count = uVar1 + 1;
                        this->data[uVar1] = pVVar11;
                      }
                    }
                    if (pVVar11->cmd == VM_INST_MEM_COPY) {
                      if ((pVVar11->arguments).count == 0) goto LAB_0028cc0c;
                      if ((VmConstant *)*(pVVar11->arguments).data == pVVar4) {
                        uVar1 = (module->tempInstructions).count;
                        if (uVar1 == (module->tempInstructions).max) {
                          SmallArray<VmInstruction_*,_128U>::grow(this,uVar1);
                        }
                        if (this->data == (VmInstruction **)0x0) {
LAB_0028cc2b:
                          __assert_fail("data",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                        ,0x162,
                                        "void SmallArray<VmInstruction *, 128>::push_back(const T &) [T = VmInstruction *, N = 128]"
                                       );
                        }
                        uVar1 = (module->tempInstructions).count;
                        (module->tempInstructions).count = uVar1 + 1;
                        this->data[uVar1] = pVVar11;
                      }
                    }
                    VVar2 = pVVar11->cmd;
                    if (VVar2 == VM_INST_MEM_COPY) {
                      if ((pVVar11->arguments).count < 3) goto LAB_0028cc0c;
                      if ((VmConstant *)(pVVar11->arguments).data[2] == pVVar4) {
                        bVar6 = true;
                      }
                    }
                    bVar7 = bVar6;
                    if ((VVar2 == VM_INST_RETURN) && (pVVar4->isReference != false)) {
                      bVar7 = true;
                    }
                    if ((VVar2 == VM_INST_CALL) && (pVVar4->isReference == true)) {
                      uVar1 = (pVVar11->arguments).count;
                      if ((ulong)uVar1 == 0) {
LAB_0028cc0c:
                        __assert_fail("index < count",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                      ,0x199,
                                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                                     );
                      }
                      ppVVar5 = (pVVar11->arguments).data;
                      uVar12 = ((*ppVVar5)->type).type == VM_TYPE_FUNCTION_REF ^ 3;
                      if (uVar12 < uVar1) {
                        uVar13 = (ulong)uVar12;
                        do {
                          if ((VmConstant *)ppVVar5[uVar13] == pVVar4) {
                            bVar7 = true;
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar1 != uVar13);
                      }
                    }
                    bVar6 = bVar7;
                    if (VVar2 - VM_INST_ADD_LOAD < 0x11) {
                      bVar6 = true;
                      bVar7 = true;
                    }
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar16);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar8);
            if (bVar7) goto LAB_0028cbec;
          }
          uVar8 = (ulong)(module->tempInstructions).count;
          if (uVar8 != 0) {
            uVar10 = 0;
            do {
              pVVar11 = (module->tempInstructions).data[uVar10];
              module->deadAllocaStoreEliminations = module->deadAllocaStoreEliminations + 1;
              VmBlock::RemoveInstruction(pVVar11->parent,pVVar11);
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
          }
        }
      }
LAB_0028cbec:
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar14);
  }
  return;
}

Assistant:

void RunDeadAlocaStoreElimination(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		if(ScopeData *scope = function->scope)
		{
			// Keep stores to globals
			if(scope == ctx.globalScope)
				return;

			for(unsigned variablePos = 0, variableCount = scope->allVariables.count; variablePos < variableCount; variablePos++)
			{
				VariableData *variable = scope->allVariables.data[variablePos];

				if(variable->isAlloca && variable->users.count == 0)
					continue;

				if(HasAddressTaken(variable))
					continue;

				bool hasLoadUsers = false;

				module->tempInstructions.clear();

				for(unsigned userPos = 0, userCount = variable->users.count; userPos < userCount; userPos++)
				{
					VmConstant *user = variable->users.data[userPos];

					for(unsigned userUserPos = 0, userUserCount = user->users.count; userUserPos < userUserCount; userUserPos++)
					{
						if(VmInstruction *inst = getType<VmInstruction>(user->users.data[userUserPos]))
						{
							if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
								hasLoadUsers = true;

							if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
								module->tempInstructions.push_back(inst);

							if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[0] == user)
								module->tempInstructions.push_back(inst);

							if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[2] == user)
								hasLoadUsers = true;

							if(inst->cmd == VM_INST_RETURN && user->isReference)
								hasLoadUsers = true;

							if(inst->cmd == VM_INST_CALL && user->isReference)
							{
								unsigned firstArgument = 3;

								if(inst->arguments[0]->type.type == VM_TYPE_FUNCTION_REF)
									firstArgument = 2;

								for(unsigned i = firstArgument; i < inst->arguments.size(); i++)
								{
									if(inst->arguments[i] == user)
										hasLoadUsers = true;
								}
							}

							if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD)
								hasLoadUsers = true;
						}
					}
				}

				if(!hasLoadUsers && module->tempInstructions.count != 0)
				{
					for(unsigned storePos = 0, storeCount = module->tempInstructions.count; storePos < storeCount; storePos++)
					{
						VmInstruction *storeInst = module->tempInstructions.data[storePos];

						module->deadAllocaStoreEliminations++;

						storeInst->parent->RemoveInstruction(storeInst);
					}
				}
			}
		}
	}
}